

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int minimum_1;
  int threads;
  int maximum;
  int minimum;
  int level;
  private_data_conflict8 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = atoi(value);
    threads = -99;
    iVar3 = string_is_numeric(value);
    if (iVar3 == 0) {
      iVar3 = ZSTD_maxCLevel();
      uVar4 = ZSTD_versionNumber();
      if (uVar4 < 0x2842) {
        uVar4 = ZSTD_versionNumber();
        if (uVar4 < 0x2840) {
          threads = 0;
        }
      }
      else {
        threads = ZSTD_minCLevel();
      }
      if ((iVar2 < threads) || (iVar3 < iVar2)) {
        f_local._4_4_ = -0x14;
      }
      else {
        *piVar1 = iVar2;
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  else {
    iVar2 = strcmp(key,"threads");
    if (iVar2 == 0) {
      iVar2 = atoi(value);
      iVar3 = string_is_numeric(value);
      if (iVar3 == 0) {
        if (iVar2 < 0) {
          f_local._4_4_ = -0x14;
        }
        else {
          piVar1[1] = iVar2;
          f_local._4_4_ = 0;
        }
      }
      else {
        f_local._4_4_ = -0x14;
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		int level = atoi(value);
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
		if (string_is_numeric(value) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		int threads = atoi(value);
		if (string_is_numeric(value) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}

		int minimum = 0;

		if (threads < minimum) {
			return (ARCHIVE_WARN);
		}

		data->threads = threads;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}